

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *
cfd::TransactionContext::CheckMultisig
          (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__return_storage_ptr__,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          Script *redeem_script)

{
  pointer pSVar1;
  size_t __n;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  iterator __position;
  CfdException *pCVar5;
  pointer pSVar6;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *signature_list;
  string pubkey_hex;
  Pubkey related_pubkey;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  SignParameter sign_param;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  string local_148;
  Pubkey local_128;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_110;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8 [32];
  pointer local_b8;
  pointer local_a8;
  undefined **local_90;
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  Script *local_60;
  Pubkey *local_58;
  Pubkey *local_50;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_48;
  
  pSVar6 = (sign_list->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (sign_list->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pSVar6 == pSVar1) ||
     (0xf < (ulong)(((long)pSVar1 - (long)pSVar6 >> 3) * -0x1111111111111111))) {
    local_d8._0_8_ = "cfd_transaction.cpp";
    local_d8._8_4_ = 0x2dc;
    local_d8._16_8_ = "CheckMultisig";
    core::logger::log<unsigned_int_const&>
              ((CfdSourceLocation *)local_d8,kCfdLogLevelWarning,
               "Failed to CheckMultisig. sign array is \'1 - {}\'.",&kMaximumMultisigKeyNum);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"Value out of range. sign array length fail.","");
    core::CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)local_d8);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_60 = redeem_script;
  core::ScriptUtil::ExtractPubkeysFromMultisigScript(&local_48,redeem_script,(uint32_t *)0x0);
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector(&local_110,sign_list)
  ;
  local_58 = local_48.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_50 = local_48.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      core::Pubkey::GetHex_abi_cxx11_
                (&local_148,
                 local_48.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      __position._M_current =
           local_110.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
      while (__position._M_current !=
             local_110.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
        SignParameter::SignParameter((SignParameter *)local_d8,__position._M_current);
        SignParameter::GetRelatedPubkey(&local_128,(SignParameter *)local_d8);
        bVar3 = core::Pubkey::IsValid(&local_128);
        if (bVar3) {
          core::Pubkey::GetHex_abi_cxx11_((string *)local_f8,&local_128);
          uVar2 = local_f8._0_8_;
          __n = CONCAT44(local_f8._12_4_,local_f8._8_4_);
          if (__n == local_148._M_string_length) {
            if (__n == 0) {
              bVar3 = false;
            }
            else {
              iVar4 = bcmp((void *)local_f8._0_8_,local_148._M_dataplus._M_p,__n);
              bVar3 = iVar4 != 0;
            }
          }
          else {
            bVar3 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar2 != &local_e8) {
            operator_delete((void *)uVar2,local_e8._M_allocated_capacity + 1);
          }
          if (bVar3) goto LAB_003cadd7;
          __position = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
                       _M_erase(&local_110,__position);
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                    (__return_storage_ptr__,(SignParameter *)local_d8);
        }
        else {
LAB_003cadd7:
          __position._M_current = __position._M_current + 1;
        }
        if (local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_128.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_128.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_90 = &PTR__ScriptOperator_0086d348;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_p != &local_70) {
          operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
        }
        if (local_b8 != (pointer)0x0) {
          operator_delete(local_b8,(long)local_a8 - (long)local_b8);
        }
        if ((pointer)local_d8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      local_48.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_start = local_50 + 1;
    } while (local_48.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_start != local_58);
  }
  if (local_110.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_110.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar6 = local_110.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      SignParameter::GetRelatedPubkey((Pubkey *)local_d8,pSVar6);
      bVar3 = core::Pubkey::IsValid((Pubkey *)local_d8);
      if ((pointer)local_d8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
      }
      if (bVar3) {
        local_f8._0_8_ = "cfd_transaction.cpp";
        local_f8._8_4_ = 0x2fe;
        local_e8._M_allocated_capacity = 0x61ae80;
        SignParameter::GetRelatedPubkey(&local_128,pSVar6);
        core::Pubkey::GetHex_abi_cxx11_((string *)local_d8,&local_128);
        core::Script::GetHex_abi_cxx11_(&local_148,local_60);
        core::logger::log<std::__cxx11::string&,std::__cxx11::string_const&>
                  ((CfdSourceLocation *)local_f8,kCfdLogLevelWarning,
                   "Failed to CheckMultisig. Missing related pubkey in script.: relatedPubkey={}, script={}"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   &local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
        if (local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_128.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_128.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_128.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,
                   "Missing related pubkey in script. Check your signature and pubkey pair.","");
        core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_d8);
        __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                (__return_storage_ptr__,pSVar6);
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != local_110.
                       super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_110);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SignParameter> TransactionContext::CheckMultisig(
    const std::vector<SignParameter>& sign_list, const Script& redeem_script) {
  // check signData (too much data)
  if (sign_list.empty() || (sign_list.size() > kMaximumMultisigKeyNum)) {
    warn(
        CFD_LOG_SOURCE, "Failed to CheckMultisig. sign array is '1 - {}'.",
        kMaximumMultisigKeyNum);
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Value out of range. sign array length fail.");
  }

  // check multisig format and extract pubkey.
  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);

  std::vector<SignParameter> signature_list;
  std::vector<SignParameter> sign_params = sign_list;
  for (const Pubkey& pubkey : pubkeys) {
    std::string pubkey_hex = pubkey.GetHex();
    for (auto itr = sign_params.begin(); itr != sign_params.end();) {
      SignParameter sign_param = *itr;
      Pubkey related_pubkey = sign_param.GetRelatedPubkey();
      if ((!related_pubkey.IsValid()) ||
          (related_pubkey.GetHex() != pubkey_hex)) {
        ++itr;
        continue;
      }

      itr = sign_params.erase(itr);
      signature_list.push_back(sign_param);
    }
  }

  // set the others to signature data
  for (const auto& sign_param : sign_params) {
    // related pubkey not found in script
    if (sign_param.GetRelatedPubkey().IsValid()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CheckMultisig. Missing related pubkey"
          " in script.: relatedPubkey={}, script={}",
          sign_param.GetRelatedPubkey().GetHex(), redeem_script.GetHex());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Missing related pubkey in script."
          " Check your signature and pubkey pair.");
    }
    signature_list.push_back(sign_param);
  }

  return signature_list;
}